

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# native.c
# Opt level: O2

Object * handle_native(Object *__return_storage_ptr__,Call c,Environment *env)

{
  undefined8 *puVar1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  code *pcVar5;
  long lVar6;
  char *name;
  long lVar7;
  ulong uVar8;
  long lVar9;
  Library *__ptr;
  
  iVar3 = strcmp(c.identifer,"LoadLibrary");
  if (iVar3 == 0) {
    load_library(__return_storage_ptr__,c.line,env,(char *)0x0);
  }
  else {
    iVar3 = strcmp(c.identifer,"UnloadLibrary");
    if (iVar3 == 0) {
      name = get_string("x",c.line,env);
      iVar4 = hasLib(name);
      __ptr = libraries;
      iVar3 = libCount;
      if (iVar4 == 0) {
        printf("\x1b[33m\n[Warning] Library \'%s\' is not loaded!\x1b[0m",name);
      }
      else if (libCount == 1) {
        unload_all();
      }
      else {
        uVar8 = 0;
        if (0 < libCount) {
          uVar8 = (ulong)(uint)libCount;
        }
        lVar9 = 0;
        do {
          lVar7 = lVar9;
          if (uVar8 * 0x10 + 0x10 == lVar7 + 0x10) goto LAB_00106c96;
          iVar4 = strcmp(*(char **)((long)&__ptr->name + lVar7),name);
          lVar9 = lVar7 + 0x10;
        } while (iVar4 != 0);
        dlclose(*(undefined8 *)((long)&__ptr->handle + lVar7));
        lVar9 = dlerror();
        if (lVar9 != 0) {
          printf("\x1b[33m\n[Warning] %s\x1b[0m",lVar9);
        }
        __ptr = libraries;
        pvVar2 = libraries[(long)libCount + -1].handle;
        puVar1 = (undefined8 *)((long)&libraries->name + lVar7);
        *puVar1 = libraries[(long)libCount + -1].name;
        puVar1[1] = pvVar2;
        iVar3 = libCount;
LAB_00106c96:
        libCount = iVar3 + -1;
        libraries = (Library *)realloc(__ptr,(long)iVar3 * 0x10 - 0x10);
      }
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x28) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x30) = 0;
      (__return_storage_ptr__->field_1).routine.arguments = (char **)0;
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = 0;
      (__return_storage_ptr__->field_1).literal.field_2 = (anon_union_8_4_50a03f35_for_Literal_2)0;
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) = 0;
      __return_storage_ptr__->type = OBJECT_NULL;
      *(undefined4 *)&__return_storage_ptr__->field_0x4 = 0;
      (__return_storage_ptr__->field_1).instance = (Instance *)0x400000000;
    }
    else {
      if (libCount == 0) {
        printf("\x1b[31m\n[Runtime Error] [Line:%d] Unable to call %s : No libraries loaded!\x1b[0m"
               ,(ulong)(uint)c.line,c.identifer);
        stop();
      }
      lVar9 = 8;
      lVar7 = -1;
      do {
        lVar7 = lVar7 + 1;
        if (libCount <= lVar7) {
          printf("\x1b[31m\n[Runtime Error] [Line:%d] Foreign routine \'%s\' not found in loaded libraries!\x1b[0m"
                 ,(ulong)(uint)c.line,c.identifer);
          stop();
        }
        puVar1 = (undefined8 *)((long)&libraries->name + lVar9);
        lVar9 = lVar9 + 0x10;
        pcVar5 = (code *)dlsym(*puVar1,c.identifer);
        lVar6 = dlerror();
      } while (lVar6 != 0);
      (*pcVar5)(__return_storage_ptr__,c.line,env);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Object handle_native(Call c, Environment *env){
    char *fname = c.identifer;
    int i = 0;
    if(strcmp(fname, "LoadLibrary") == 0)
        return load_library(c.line, env, NULL);
    else if(strcmp(fname, "UnloadLibrary") == 0)
        return unload_library(c.line, env);
    else
        return run_native(c, env);
}